

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O0

pboolean p_socket_address_to_native(PSocketAddress *addr,ppointer dest,psize destlen)

{
  bool bVar1;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  psize destlen_local;
  ppointer dest_local;
  PSocketAddress *addr_local;
  
  bVar1 = true;
  if ((addr != (PSocketAddress *)0x0) && (bVar1 = true, dest != (ppointer)0x0)) {
    bVar1 = destlen == 0;
  }
  if (bVar1) {
    addr_local._4_4_ = 0;
  }
  else if (addr->family == P_SOCKET_FAMILY_INET) {
    if (destlen < 0x10) {
      printf("** Warning: %s **\n",
             "PSocketAddress::p_socket_address_to_native: invalid buffer size for IPv4");
      addr_local._4_4_ = 0;
    }
    else {
      *(in_addr_t *)((long)dest + 4) = (addr->addr).sin_addr.s_addr;
      *(undefined2 *)dest = 2;
      *(puint16 *)((long)dest + 2) = addr->port >> 8 | addr->port << 8;
      memset((void *)((long)dest + 8),0,8);
      addr_local._4_4_ = 1;
    }
  }
  else if (addr->family == P_SOCKET_FAMILY_INET6) {
    if (destlen < 0x1c) {
      printf("** Error: %s **\n",
             "PSocketAddress::p_socket_address_to_native: invalid buffer size for IPv6");
      addr_local._4_4_ = 0;
    }
    else {
      *(undefined8 *)((long)dest + 8) = *(undefined8 *)&addr->addr;
      *(undefined8 *)((long)dest + 0x10) = *(undefined8 *)((long)&addr->addr + 8);
      *(undefined2 *)dest = 10;
      *(puint16 *)((long)dest + 2) = addr->port >> 8 | addr->port << 8;
      *(puint32 *)((long)dest + 4) = addr->flowinfo;
      *(puint32 *)((long)dest + 0x18) = addr->scope_id;
      addr_local._4_4_ = 1;
    }
  }
  else {
    printf("** Warning: %s **\n",
           "PSocketAddress::p_socket_address_to_native: unsupported socket address");
    addr_local._4_4_ = 0;
  }
  return addr_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_socket_address_to_native (const PSocketAddress	*addr,
			    ppointer			dest,
			    psize			destlen)
{
	struct sockaddr_in	*sin;
#ifdef AF_INET6
	struct sockaddr_in6	*sin6;
#endif

	if (P_UNLIKELY (addr == NULL || dest == NULL || destlen == 0))
		return FALSE;

	sin = (struct sockaddr_in *) dest;
#ifdef AF_INET6
	sin6 = (struct sockaddr_in6 *) dest;
#endif

	if (addr->family == P_SOCKET_FAMILY_INET) {
		if (P_UNLIKELY (destlen < sizeof (struct sockaddr_in))) {
			P_WARNING ("PSocketAddress::p_socket_address_to_native: invalid buffer size for IPv4");
			return FALSE;
		}

		memcpy (&sin->sin_addr, &addr->addr.sin_addr, sizeof (struct in_addr));
		sin->sin_family = AF_INET;
		sin->sin_port   = p_htons (addr->port);
		memset (sin->sin_zero, 0, sizeof (sin->sin_zero));
		return TRUE;
	}
#ifdef AF_INET6
	else if (addr->family == P_SOCKET_FAMILY_INET6) {
		if (P_UNLIKELY (destlen < sizeof (struct sockaddr_in6))) {
			P_ERROR ("PSocketAddress::p_socket_address_to_native: invalid buffer size for IPv6");
			return FALSE;
		}

		memcpy (&sin6->sin6_addr, &addr->addr.sin6_addr, sizeof (struct in6_addr));
		sin6->sin6_family   = AF_INET6;
		sin6->sin6_port     = p_htons (addr->port);
#ifdef PLIBSYS_SOCKADDR_IN6_HAS_FLOWINFO
		sin6->sin6_flowinfo = addr->flowinfo;
#endif
#ifdef PLIBSYS_SOCKADDR_IN6_HAS_SCOPEID
		sin6->sin6_scope_id = addr->scope_id;
#endif
		return TRUE;
	}
#endif
	else {
		P_WARNING ("PSocketAddress::p_socket_address_to_native: unsupported socket address");
		return FALSE;
	}
}